

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall QRasterPaintEngine::fillRect(QRasterPaintEngine *this,QRectF *r,QBrush *brush)

{
  QRasterPaintEngineState *this_00;
  QBrush *in_RDI;
  QRasterPaintEngineState *s;
  QRectF *in_stack_00000028;
  QRasterPaintEngine *in_stack_00000030;
  
  this_00 = state((QRasterPaintEngine *)0x569075);
  ensureBrush((QRasterPaintEngine *)this_00,in_RDI);
  if ((this_00->brushData).blend != (ProcessSpans)0x0) {
    fillRect(in_stack_00000030,in_stack_00000028,(QSpanData *)this);
  }
  return;
}

Assistant:

void QRasterPaintEngine::fillRect(const QRectF &r, const QBrush &brush)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::fillRecct(): " << r << brush;
#endif
    QRasterPaintEngineState *s = state();

    ensureBrush(brush);
    if (!s->brushData.blend)
        return;

    fillRect(r, &s->brushData);
}